

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O3

double units::precise::equations::convert_equnit_to_value(double val,unit_data *UT)

{
  unit_data uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  uVar1 = *UT;
  if (-1 < (int)uVar1) {
    return val;
  }
  uVar2 = (uint)uVar1 & 0xc000000;
  switch(((uint)uVar1 >> 0x1e & 1 | (uint)uVar1 >> 0x1c & 2 | (uint)uVar1 >> 0x1a & 4) +
         (uint)(uVar2 != 0) * 8 | (uint)(((uint)uVar1 & 0xe00000) != 0) << 4) {
  case 0:
  case 10:
    break;
  case 1:
    if (((uint)uVar1 & 0xfffffff) == 0x1d2) {
      dVar4 = 0.5;
    }
    else {
      dVar4 = *(double *)(&DAT_003dd880 + (ulong)(uVar2 == 0x8000000) * 8);
    }
    val = val / dVar4;
    goto switchD_0021d484_caseD_9;
  case 2:
    if (((uint)uVar1 & 0xfffffff) == 0x1d2) {
      dVar4 = 1.0;
    }
    else {
      dVar4 = *(double *)(&DAT_003dd870 + (ulong)(uVar2 == 0x8000000) * 8);
    }
    val = val / dVar4;
    break;
  case 3:
    dVar4 = 10.0;
    dVar3 = 10.0;
    if (((uint)uVar1 & 0xfffffff) != 0x1d2) {
      dVar3 = *(double *)(&DAT_003dd860 + (ulong)(uVar2 == 0x8000000) * 8);
    }
    val = val / dVar3;
    goto LAB_0021d715;
  case 4:
    val = -val;
    break;
  case 5:
    val = -val;
    dVar4 = 100.0;
    goto LAB_0021d715;
  case 6:
    val = -val;
    dVar4 = 1000.0;
    goto LAB_0021d715;
  case 7:
    val = -val;
    dVar4 = 50000.0;
    goto LAB_0021d715;
  case 8:
    dVar4 = exp2(val);
    return dVar4;
  case 9:
    goto switchD_0021d484_caseD_9;
  case 0xb:
    dVar4 = 10.0;
    val = val / 10.0;
    goto LAB_0021d715;
  case 0xc:
    val = val * 0.5;
    break;
  case 0xd:
    val = val / 20.0;
    break;
  case 0xe:
    dVar4 = 3.0;
    goto LAB_0021d715;
  case 0xf:
    val = val + val;
    goto switchD_0021d484_caseD_9;
  case 0x10:
    dVar3 = val + 131.5;
    dVar4 = 141.5;
    goto LAB_0021d69f;
  case 0x11:
    dVar3 = val + 130.0;
    dVar4 = 140.0;
LAB_0021d69f:
    return dVar4 / dVar3;
  case 0x12:
    return 145.0 / (145.0 - val);
  default:
    return val;
  case 0x16:
    dVar4 = fma(val,-0.17613636364,2.8851010101);
    dVar4 = fma(dVar4,val,-14.95265151515);
    dVar4 = fma(dVar4,val,47.85191197691);
    dVar3 = 38.90151515152;
    goto LAB_0021d6f4;
  case 0x17:
    dVar4 = fma(val,0.00177396133,-0.05860071301);
    dVar4 = fma(dVar4,val,0.93621452077);
    dVar4 = fma(dVar4,val,0.2424609704);
    dVar3 = -0.12475759535;
LAB_0021d6f4:
    dVar4 = fma(dVar4,val,dVar3);
    return dVar4;
  case 0x18:
    dVar4 = pow(val + 2.0,1.5);
    return dVar4 * 14.1;
  case 0x1b:
    dVar4 = atan(val / 100.0);
    return dVar4;
  case 0x1d:
    dVar4 = val + 10.7;
    goto LAB_0021d60e;
  case 0x1e:
    dVar4 = val + 3.2;
LAB_0021d60e:
    val = dVar4 * 1.5;
  }
  dVar4 = 10.0;
LAB_0021d715:
  dVar4 = pow(dVar4,val);
  return dVar4;
switchD_0021d484_caseD_9:
  dVar4 = exp(val);
  return dVar4;
}

Assistant:

inline double
            convert_equnit_to_value(double val, const detail::unit_data& UT)
        {
            if (!UT.is_equation()) {
                return val;
            }
            int logtype = custom::eq_type(UT);
            switch (logtype) {
                case 0:
                case 10:
                    return std::pow(10.0, val);
                case 1:
                    return std::exp(val / ((is_power_unit(UT)) ? 0.5 : 1.0));
                case 2:
                    return std::pow(
                        10.0, val / ((is_power_unit(UT)) ? 1.0 : 2.0));
                case 3:
                    return std::pow(
                        10.0, val / ((is_power_unit(UT)) ? 10.0 : 20.0));
                case 4:
                    return std::pow(10.0, -val);
                case 5:
                    return std::pow(100.0, -val);
                case 6:
                    return std::pow(1000.0, -val);
                case 7:
                    return std::pow(50000.0, -val);
                case 8:
                    return std::exp2(val);
                case 9:
                    return std::exp(val);
                case 11:
                    return std::pow(10.0, val / 10.0);
                case 12:
                    return std::pow(10.0, val / 2.0);
                case 13:
                    return std::pow(10.0, val / 20.0);
                case 14:
                    return std::pow(3.0, val);
                case 15:
                    return std::exp(val / 0.5);
                case 16:  // API Gravity
                    return 141.5 / (val + 131.5);
                case 17:  // degrees Baume Light
                    return 140.0 / (130.0 + val);
                case 18:  // degrees Baume Heavy
                    return 145.0 / (145.0 - val);
                case 22:  // saffir simpson hurricane wind scale
                {
                    double out = -0.17613636364;
                    out = std::fma(out, val, 2.88510101010);
                    out = std::fma(out, val, -14.95265151515);
                    out = std::fma(out, val, 47.85191197691);
                    out = std::fma(out, val, 38.90151515152);
                    return out;
                }
                case 23: {  // Beaufort wind scale
                    double out = 0.00177396133;
                    out = std::fma(out, val, -0.05860071301);
                    out = std::fma(out, val, 0.93621452077);
                    out = std::fma(out, val, 0.24246097040);
                    out = std::fma(out, val, -0.12475759535);
                    return out;
                }
                case 24:  // Fujita scale
                    return 14.1 * std::pow(val + 2.0, 1.5);
                case 27:  // prism diopter
                    return std::atan(val / 100.0);
                case 29:  // moment magnitude scale
                    return std::pow(10.0, (val + 10.7) * 1.5);
                case 30:
                    return std::pow(10.0, (val + 3.2) * 1.5);
                default:
                    return val;
            }
        }